

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

_Bool Curl_conn_data_pending(Curl_easy *data,int sockindex)

{
  bool bVar1;
  Curl_cfilter *local_28;
  Curl_cfilter *cf;
  int sockindex_local;
  Curl_easy *data_local;
  
  local_28 = data->conn->cfilter[sockindex];
  while( true ) {
    bVar1 = false;
    if (local_28 != (Curl_cfilter *)0x0) {
      bVar1 = (local_28->field_0x24 & 1) == 0;
    }
    if (!bVar1) break;
    local_28 = local_28->next;
  }
  if (local_28 == (Curl_cfilter *)0x0) {
    data_local._7_1_ = false;
  }
  else {
    data_local._7_1_ = (*local_28->cft->has_data_pending)(local_28,data);
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_conn_data_pending(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  (void)data;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->has_data_pending(cf, data);
  }
  return FALSE;
}